

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ciphercommon_hw.c
# Opt level: O0

int ossl_cipher_hw_generic_ecb(PROV_CIPHER_CTX *dat,uchar *out,uchar *in,size_t len)

{
  ulong uVar1;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t bl;
  size_t i;
  ulong local_30;
  
  uVar1 = in_RDI[5];
  if (uVar1 <= in_RCX) {
    if (in_RDI[1] == 0) {
      for (local_30 = 0; local_30 <= in_RCX - uVar1; local_30 = uVar1 + local_30) {
        (*(code *)*in_RDI)(in_RDX + local_30,in_RSI + local_30,in_RDI[0x16]);
      }
    }
    else {
      (*(code *)in_RDI[1])
                (in_RDX,in_RSI,in_RCX,in_RDI[0x16],*(byte *)((long)in_RDI + 0x3c) >> 1 & 1);
    }
  }
  return 1;
}

Assistant:

int ossl_cipher_hw_generic_ecb(PROV_CIPHER_CTX *dat, unsigned char *out,
                               const unsigned char *in, size_t len)
{
    size_t i, bl = dat->blocksize;

    if (len < bl)
        return 1;

    if (dat->stream.ecb) {
        (*dat->stream.ecb) (in, out, len, dat->ks, dat->enc);
    }
    else {
        for (i = 0, len -= bl; i <= len; i += bl)
            (*dat->block) (in + i, out + i, dat->ks);
    }

    return 1;
}